

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool pegmatite::parse(Input *i,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *delegate,void *d)

{
  bool bVar1;
  Context con;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Context local_140;
  InputRange local_50;
  
  Context::Context(&local_140,i,ws,delegate);
  Context::parse_term(&local_140,local_140.whitespace_rule);
  bVar1 = Context::parse_non_term(&local_140,g);
  if (bVar1) {
    Context::parse_term(&local_140,local_140.whitespace_rule);
    if ((local_140.position.it.buffer == local_140.finish.buffer) &&
       (local_140.position.it.idx == local_140.finish.idx)) {
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&local_140.cache._M_h);
      bVar1 = Context::do_parse_procs(&local_140,d);
      goto LAB_0013993a;
    }
    if (local_140.error_pos.it.idx < local_140.finish.idx) goto LAB_0013992b;
    InputRange::InputRange(&local_50,&local_140.error_pos,&local_140.error_pos);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"EOF",&local_161);
    std::
    function<void_(const_pegmatite::InputRange_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(err,&local_50,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  else {
LAB_0013992b:
    _syntax_Error(err,&local_140);
  }
  bVar1 = false;
LAB_0013993a:
  Context::~Context(&local_140);
  return bVar1;
}

Assistant:

bool parse(Input &i, const Rule &g, const Rule &ws, ErrorReporter &err,
           const ParserDelegate &delegate, void *d)
{
	//prepare context
	Context con(i, ws, delegate);

	//parse initial whitespace
	con.parse_term(con.whitespace_rule);

	//parse grammar
	if (!con.parse_non_term(g))
	{
		_syntax_Error(err, con);
		return false;
	}

	//parse whitespace at the end
	con.parse_term(con.whitespace_rule);

	//if end is not reached, there was an error
	if (!con.end())
	{
		if (con.error_pos.it < con.finish)
		{
			_syntax_Error(err, con);
		}
		else
		{
			_eof_Error(err, con);
		}
		return false;
	}

	con.clear_cache();

	//success; execute the parse procedures
	return con.do_parse_procs(d);
}